

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

wchar_t cmd_get_arg(command *cmd,char *arg,cmd_arg_type type,cmd_arg_data *data)

{
  int iVar1;
  ulong local_38;
  size_t i;
  cmd_arg_data *data_local;
  cmd_arg_type type_local;
  char *arg_local;
  command *cmd_local;
  
  local_38 = 0;
  while( true ) {
    if (3 < local_38) {
      return L'\xffffffff';
    }
    iVar1 = strcmp(cmd->arg[local_38].name,arg);
    if (iVar1 == 0) break;
    local_38 = local_38 + 1;
  }
  if (cmd->arg[local_38].type != type) {
    return L'\xfffffffe';
  }
  *data = (cmd_arg_data)cmd->arg[local_38].data;
  return L'\0';
}

Assistant:

static int cmd_get_arg(struct command *cmd, const char *arg,
					   enum cmd_arg_type type, union cmd_arg_data *data)
{
	size_t i;

	for (i = 0; i < CMD_MAX_ARGS; i++) {
		if (streq(cmd->arg[i].name, arg)) {
			if (cmd->arg[i].type != type)
				return CMD_ARG_WRONG_TYPE;

			*data = cmd->arg[i].data;
			return CMD_OK;
		}
	}

	return CMD_ARG_NOT_PRESENT;
 }